

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

ChaiScript_Basic * __thiscall
chaiscript::ChaiScript_Basic::add_global(ChaiScript_Basic *this,Boxed_Value *t_bv,string *t_name)

{
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  string local_38;
  
  Name_Validator::validate_object_name<std::__cxx11::string>(t_name);
  Catch::clara::std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_48,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)t_bv);
  std::__cxx11::string::string((string *)&local_38,t_name);
  detail::Dispatch_Engine::add_global(&this->m_engine,(Boxed_Value *)&_Stack_48,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&_Stack_48._M_refcount);
  return this;
}

Assistant:

ChaiScript_Basic &add_global(const Boxed_Value &t_bv, const std::string &t_name) {
      Name_Validator::validate_object_name(t_name);
      m_engine.add_global(t_bv, t_name);
      return *this;
    }